

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Unpack(void *inbuf,int insize,int *position,void *outbuf,int outcount,
                 MPIABI_Datatype datatype,MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Unpack();
  return iVar1;
}

Assistant:

int MPIABI_Unpack(
  const void * inbuf,
  int insize,
  int * position,
  void * outbuf,
  int outcount,
  MPIABI_Datatype datatype,
  MPIABI_Comm comm
) {
  return MPI_Unpack(
    inbuf,
    insize,
    position,
    outbuf,
    outcount,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Comm)(WPI_Comm)comm
  );
}